

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O3

void lyplg_ext_cfree_instance_substatements(ly_ctx *ctx,lysc_ext_substmt *substmts)

{
  ushort uVar1;
  ly_stmt lVar2;
  lysc_node *plVar3;
  lysc_ext_instance *plVar4;
  lysc_ext_substmt *plVar5;
  lysc_ext_instance *plVar6;
  lysc_when **w;
  lysc_node *node;
  void **ppvVar7;
  void *pvVar8;
  lysf_ctx local_58;
  lysc_ext_substmt *local_38;
  
  local_58.mod = (lys_module *)0x0;
  local_58.ext_set.size = 0;
  local_58.ext_set.count = 0;
  local_58.ext_set.field_2.dnodes = (lyd_node **)0x0;
  if (substmts != (lysc_ext_substmt *)0x0) {
    plVar5 = substmts + -1;
    local_58.ctx = ctx;
    if (substmts[-1].storage_p != (void **)0x0) {
      ppvVar7 = (void **)0x0;
      local_38 = substmts;
      do {
        w = (lysc_when **)substmts[(long)ppvVar7].storage_p;
        if (w == (lysc_when **)0x0) goto LAB_0015f149;
        lVar2 = substmts[(long)ppvVar7].stmt;
        if ((int)lVar2 < 0x130000) {
          if ((int)lVar2 < 0x20000) {
            if ((int)lVar2 < 0x100) {
              if ((lVar2 - LY_STMT_NOTIFICATION < 0x40) &&
                 ((0x800000008000808bU >> ((ulong)(lVar2 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0))
              goto LAB_0015ecaa;
              if (lVar2 != LY_STMT_AUGMENT) goto LAB_0015f098;
              goto LAB_0015f149;
            }
            if ((int)lVar2 < 0x1000) {
              if ((int)lVar2 < 0x400) {
                if ((lVar2 == LY_STMT_CASE) || (lVar2 == LY_STMT_CHOICE)) goto LAB_0015ecaa;
              }
              else {
                if (lVar2 == LY_STMT_CONTAINER) goto LAB_0015ecaa;
                if (lVar2 == LY_STMT_GROUPING) goto LAB_0015f149;
              }
            }
            else if ((int)lVar2 < 0x4000) {
              if ((lVar2 == LY_STMT_LEAF) || (lVar2 == LY_STMT_LEAF_LIST)) goto LAB_0015ecaa;
            }
            else {
              if (lVar2 == LY_STMT_LIST) {
LAB_0015ecaa:
                node = (lysc_node *)*w;
                if (node != (lysc_node *)0x0) {
                  do {
                    plVar3 = node->next;
                    uVar1 = node->nodetype;
                    lysc_node_free_(&local_58,node);
                    if ((uVar1 & 0x3000) != 0) {
                      free(node);
                    }
                    node = plVar3;
                  } while (plVar3 != (lysc_node *)0x0);
                  w = (lysc_when **)substmts[(long)ppvVar7].storage_p;
                  substmts = local_38;
                }
                *w = (lysc_when *)0x0;
                goto LAB_0015f149;
              }
              if (lVar2 == LY_STMT_USES) goto LAB_0015f149;
              if (lVar2 == LY_STMT_ARGUMENT) goto LAB_0015f029;
            }
            goto LAB_0015f098;
          }
          if ((int)lVar2 < 0xa0000) {
            if ((int)lVar2 < 0x60000) {
              if ((int)lVar2 < 0x40000) {
                if ((lVar2 != LY_STMT_BASE) && (lVar2 != LY_STMT_BELONGS_TO)) goto LAB_0015f098;
              }
              else if (lVar2 == LY_STMT_BIT) {
LAB_0015f04b:
                plVar4 = (lysc_ext_instance *)*w;
                if (plVar4 != (lysc_ext_instance *)0x0) {
                  if (plVar4[-1].compiled != (void *)0x0) {
                    pvVar8 = (void *)0x0;
                    plVar6 = plVar4;
                    do {
                      lysc_enum_item_free(&local_58,(lysc_type_bitenum_item *)plVar6);
                      pvVar8 = (void *)((long)pvVar8 + 1);
                      plVar6 = (lysc_ext_instance *)&plVar6->parent_stmt;
                    } while (pvVar8 < plVar4[-1].compiled);
                  }
                  goto LAB_0015f13b;
                }
              }
              else if (lVar2 != LY_STMT_CONFIG) goto LAB_0015f098;
            }
            else if ((int)lVar2 < 0x80000) {
              if (lVar2 == LY_STMT_CONTACT) goto LAB_0015f029;
              if (lVar2 != LY_STMT_DEFAULT) goto LAB_0015f098;
            }
            else {
              if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_0015f029;
              if (lVar2 != LY_STMT_DEVIATE) goto LAB_0015f098;
            }
          }
          else if ((int)lVar2 < 0xe0000) {
            if ((int)lVar2 < 0xc0000) {
              if (lVar2 == LY_STMT_DEVIATION) goto LAB_0015f149;
              if (lVar2 == LY_STMT_ENUM) goto LAB_0015f04b;
            }
            else if ((lVar2 == LY_STMT_ERROR_APP_TAG) || (lVar2 == LY_STMT_ERROR_MESSAGE))
            goto LAB_0015f029;
LAB_0015f098:
            ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
                   ,0x6a2);
          }
          else if ((int)lVar2 < 0x100000) {
            if (lVar2 != LY_STMT_EXTENSION) {
              if (lVar2 != LY_STMT_EXTENSION_INSTANCE) goto LAB_0015f098;
              plVar4 = (lysc_ext_instance *)*w;
              if (plVar4 != (lysc_ext_instance *)0x0) {
                if (plVar4[-1].compiled != (void *)0x0) {
                  pvVar8 = (void *)0x0;
                  plVar6 = plVar4;
                  do {
                    lysc_ext_instance_free(&local_58,plVar6);
                    pvVar8 = (void *)((long)pvVar8 + 1);
                    plVar6 = plVar6 + 1;
                  } while (pvVar8 < plVar4[-1].compiled);
                }
                goto LAB_0015f13b;
              }
            }
          }
          else if ((lVar2 != LY_STMT_FEATURE) && (lVar2 != LY_STMT_FRACTION_DIGITS)) {
            if (lVar2 != LY_STMT_IDENTITY) goto LAB_0015f098;
            plVar4 = (lysc_ext_instance *)*w;
            if (plVar4 != (lysc_ext_instance *)0x0) {
              if (plVar4[-1].compiled != (void *)0x0) {
                pvVar8 = (void *)0x0;
                plVar6 = plVar4;
                do {
                  lysc_ident_free(&local_58,(lysc_ident *)plVar6);
                  pvVar8 = (void *)((long)pvVar8 + 1);
                  plVar6 = (lysc_ext_instance *)&plVar6->substmts;
                } while (pvVar8 < plVar4[-1].compiled);
              }
LAB_0015f13b:
              free(&plVar4[-1].compiled);
            }
          }
        }
        else {
          if ((int)lVar2 < 0x240000) {
            if ((int)lVar2 < 0x1b0000) {
              if ((int)lVar2 < 0x170000) {
                if ((int)lVar2 < 0x150000) {
                  if ((lVar2 != LY_STMT_IF_FEATURE) && (lVar2 != LY_STMT_IMPORT)) goto LAB_0015f098;
                }
                else if (lVar2 != LY_STMT_INCLUDE) {
                  if (lVar2 == LY_STMT_KEY) goto LAB_0015f029;
                  goto LAB_0015f098;
                }
              }
              else if ((int)lVar2 < 0x190000) {
                if (lVar2 == LY_STMT_LENGTH) goto LAB_0015f039;
                if (lVar2 != LY_STMT_MANDATORY) goto LAB_0015f098;
              }
              else if ((lVar2 != LY_STMT_MAX_ELEMENTS) && (lVar2 != LY_STMT_MIN_ELEMENTS))
              goto LAB_0015f098;
            }
            else if ((int)lVar2 < 0x1f0000) {
              if ((int)lVar2 < 0x1d0000) {
                if (lVar2 == LY_STMT_MODIFIER) {
LAB_0015f029:
                  lydict_remove(ctx,(char *)*w);
                }
                else if (lVar2 != LY_STMT_MODULE) goto LAB_0015f098;
              }
              else {
                if (lVar2 != LY_STMT_MUST) {
                  if (lVar2 != LY_STMT_NAMESPACE) goto LAB_0015f098;
                  goto LAB_0015f029;
                }
                plVar4 = (lysc_ext_instance *)*w;
                if (plVar4 != (lysc_ext_instance *)0x0) {
                  if (plVar4[-1].compiled != (void *)0x0) {
                    pvVar8 = (void *)0x0;
                    plVar6 = plVar4;
                    do {
                      lysc_must_free(&local_58,(lysc_must *)plVar6);
                      pvVar8 = (void *)((long)pvVar8 + 1);
                      plVar6 = (lysc_ext_instance *)&plVar6->substmts;
                    } while (pvVar8 < plVar4[-1].compiled);
                  }
                  goto LAB_0015f13b;
                }
              }
            }
            else if ((int)lVar2 < 0x210000) {
              if (lVar2 != LY_STMT_ORDERED_BY) {
                if (lVar2 != LY_STMT_ORGANIZATION) goto LAB_0015f098;
                goto LAB_0015f029;
              }
            }
            else if (lVar2 != LY_STMT_PATH) {
              if (lVar2 == LY_STMT_PATTERN) {
                plVar4 = (lysc_ext_instance *)*w;
                if (plVar4 != (lysc_ext_instance *)0x0) {
                  if (plVar4[-1].compiled != (void *)0x0) {
                    pvVar8 = (void *)0x0;
                    plVar6 = plVar4;
                    do {
                      lysc_pattern_free(&local_58,(lysc_pattern **)plVar6);
                      pvVar8 = (void *)((long)pvVar8 + 1);
                      plVar6 = (lysc_ext_instance *)&plVar6->argument;
                    } while (pvVar8 < plVar4[-1].compiled);
                  }
                  goto LAB_0015f13b;
                }
              }
              else if (lVar2 != LY_STMT_POSITION) goto LAB_0015f098;
            }
            goto LAB_0015f149;
          }
          if (0x2cffff < (int)lVar2) {
            if ((int)lVar2 < 0x310000) {
              if ((int)lVar2 < 0x2f0000) {
                if (lVar2 != LY_STMT_SUBMODULE) {
                  if (lVar2 != LY_STMT_TYPE) goto LAB_0015f098;
                  lysc_type_free(&local_58,(lysc_type *)*w);
                }
              }
              else if ((lVar2 != LY_STMT_TYPEDEF) && (lVar2 != LY_STMT_UNIQUE)) goto LAB_0015f098;
            }
            else if ((int)lVar2 < 0x330000) {
              if (lVar2 == LY_STMT_UNITS) goto LAB_0015f029;
              if (lVar2 != LY_STMT_VALUE) goto LAB_0015f098;
            }
            else if (lVar2 == LY_STMT_WHEN) {
              lysc_when_free(&local_58,w);
            }
            else if ((lVar2 != LY_STMT_YANG_VERSION) && (lVar2 != LY_STMT_YIN_ELEMENT))
            goto LAB_0015f098;
            goto LAB_0015f149;
          }
          if ((int)lVar2 < 0x280000) {
            if ((int)lVar2 < 0x260000) {
              if (lVar2 != LY_STMT_PREFIX) {
                if (lVar2 == LY_STMT_PRESENCE) goto LAB_0015f029;
                goto LAB_0015f098;
              }
            }
            else {
              if (lVar2 != LY_STMT_RANGE) {
                if (lVar2 == LY_STMT_REFERENCE) goto LAB_0015f029;
                goto LAB_0015f098;
              }
LAB_0015f039:
              lysc_range_free(&local_58,(lysc_range *)*w);
            }
          }
          else if ((int)lVar2 < 0x2a0000) {
            if ((lVar2 != LY_STMT_REFINE) && (lVar2 != LY_STMT_REQUIRE_INSTANCE)) goto LAB_0015f098;
          }
          else if ((lVar2 != LY_STMT_REVISION) &&
                  ((lVar2 != LY_STMT_REVISION_DATE && (lVar2 != LY_STMT_STATUS))))
          goto LAB_0015f098;
        }
LAB_0015f149:
        ppvVar7 = (void **)((long)ppvVar7 + 1);
      } while (ppvVar7 < plVar5->storage_p);
    }
    free(&plVar5->storage_p);
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyplg_ext_cfree_instance_substatements(const struct ly_ctx *ctx, struct lysc_ext_substmt *substmts)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};
    ly_bool node_free;

    LY_ARRAY_FOR(substmts, u) {
        if (!substmts[u].storage_p) {
            continue;
        }

        switch (substmts[u].stmt) {
        case LY_STMT_NOTIFICATION:
        case LY_STMT_INPUT:
        case LY_STMT_OUTPUT:
        case LY_STMT_ACTION:
        case LY_STMT_RPC:
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_CASE:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST: {
            struct lysc_node *child, *child_next;

            LY_LIST_FOR_SAFE(*substmts[u].storage_p, child_next, child) {
                node_free = (child->nodetype & (LYS_INPUT | LYS_OUTPUT)) ? 1 : 0;
                lysc_node_free_(&fctx, child);
                if (node_free) {
                    free(child);
                }
            }
            *substmts[u].storage_p = NULL;
            break;
        }
        case LY_STMT_USES:
        case LY_STMT_CONFIG:
        case LY_STMT_FRACTION_DIGITS:
        case LY_STMT_MANDATORY:
        case LY_STMT_MAX_ELEMENTS:
        case LY_STMT_MIN_ELEMENTS:
        case LY_STMT_ORDERED_BY:
        case LY_STMT_POSITION:
        case LY_STMT_REQUIRE_INSTANCE:
        case LY_STMT_STATUS:
        case LY_STMT_VALUE:
            /* nothing to do */
            break;

        case LY_STMT_ARGUMENT:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_ERROR_APP_TAG:
        case LY_STMT_ERROR_MESSAGE:
        case LY_STMT_KEY:
        case LY_STMT_MODIFIER:
        case LY_STMT_NAMESPACE:
        case LY_STMT_ORGANIZATION:
        case LY_STMT_PRESENCE:
        case LY_STMT_REFERENCE:
        case LY_STMT_UNITS: {
            /* single item */
            const char *str = *substmts[u].storage_p;

            lydict_remove(ctx, str);
            break;
        }
        case LY_STMT_BIT:
        case LY_STMT_ENUM: {
            /* sized array */
            struct lysc_type_bitenum_item *items = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, items, lysc_enum_item_free);
            break;
        }
        case LY_STMT_LENGTH:
        case LY_STMT_RANGE: {
            /* single item */
            struct lysc_range *range = *substmts[u].storage_p;

            lysc_range_free(&fctx, range);
            break;
        }
        case LY_STMT_MUST: {
            /* sized array */
            struct lysc_must *musts = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, musts, lysc_must_free);
            break;
        }
        case LY_STMT_WHEN:
            /* single item, expects a pointer */
            lysc_when_free(&fctx, (struct lysc_when **)substmts[u].storage_p);
            break;

        case LY_STMT_PATTERN: {
            /* sized array of pointers */
            struct lysc_pattern **patterns = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, patterns, lysc_pattern_free);
            break;
        }
        case LY_STMT_TYPE: {
            /* single item */
            struct lysc_type *type = *substmts[u].storage_p;

            lysc_type_free(&fctx, type);
            break;
        }
        case LY_STMT_IDENTITY: {
            /* sized array */
            struct lysc_ident *idents = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, idents, lysc_ident_free);
            break;
        }
        case LY_STMT_EXTENSION_INSTANCE: {
            /* sized array */
            struct lysc_ext_instance *exts = *substmts[u].storage_p;

            FREE_ARRAY(&fctx, exts, lysc_ext_instance_free);
            break;
        }
        case LY_STMT_AUGMENT:
        case LY_STMT_BASE:
        case LY_STMT_BELONGS_TO:
        case LY_STMT_DEFAULT:
        case LY_STMT_DEVIATE:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IF_FEATURE:
        case LY_STMT_IMPORT:
        case LY_STMT_INCLUDE:
        case LY_STMT_MODULE:
        case LY_STMT_PATH:
        case LY_STMT_PREFIX:
        case LY_STMT_REFINE:
        case LY_STMT_REVISION:
        case LY_STMT_REVISION_DATE:
        case LY_STMT_SUBMODULE:
        case LY_STMT_TYPEDEF:
        case LY_STMT_UNIQUE:
        case LY_STMT_YANG_VERSION:
        case LY_STMT_YIN_ELEMENT:
            /* it is not possible to compile these statements */
            break;

        default:
            LOGINT(ctx);
        }
    }

    LY_ARRAY_FREE(substmts);
}